

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# showref.cpp
# Opt level: O1

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::ShowRef::Copy(ShowRef *this)

{
  ShowType SVar1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var3;
  tuple<duckdb::ShowRef_*,_std::default_delete<duckdb::ShowRef>_> this_00;
  pointer pSVar4;
  pointer pQVar5;
  type target;
  TableRef *in_RSI;
  templated_unique_single_t copy;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_30;
  __uniq_ptr_impl<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>_> local_28;
  
  this_00.super__Tuple_impl<0UL,_duckdb::ShowRef_*,_std::default_delete<duckdb::ShowRef>_>.
  super__Head_base<0UL,_duckdb::ShowRef_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::ShowRef_*,_std::default_delete<duckdb::ShowRef>_>)
       operator_new(0x98);
  ShowRef((ShowRef *)
          this_00.super__Tuple_impl<0UL,_duckdb::ShowRef_*,_std::default_delete<duckdb::ShowRef>_>.
          super__Head_base<0UL,_duckdb::ShowRef_*,_false>._M_head_impl);
  local_28._M_t.super__Tuple_impl<0UL,_duckdb::ShowRef_*,_std::default_delete<duckdb::ShowRef>_>.
  super__Head_base<0UL,_duckdb::ShowRef_*,_false>._M_head_impl =
       (tuple<duckdb::ShowRef_*,_std::default_delete<duckdb::ShowRef>_>)
       (tuple<duckdb::ShowRef_*,_std::default_delete<duckdb::ShowRef>_>)
       this_00.super__Tuple_impl<0UL,_duckdb::ShowRef_*,_std::default_delete<duckdb::ShowRef>_>.
       super__Head_base<0UL,_duckdb::ShowRef_*,_false>._M_head_impl;
  pSVar4 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                     ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                      &local_28);
  ::std::__cxx11::string::_M_assign((string *)&pSVar4->table_name);
  if (in_RSI[1].alias.field_2._M_allocated_capacity == 0) {
    local_30._M_head_impl = (QueryNode *)0x0;
  }
  else {
    pQVar5 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                       ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>
                         *)&in_RSI[1].alias.field_2._M_allocated_capacity);
    (*pQVar5->_vptr_QueryNode[5])(&local_30,pQVar5);
  }
  pSVar4 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                     ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                      &local_28);
  _Var3._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (QueryNode *)0x0;
  _Var2._M_head_impl =
       (pSVar4->query).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
       _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (pSVar4->query).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var3._M_head_impl;
  if (_Var2._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
  }
  if (local_30._M_head_impl != (QueryNode *)0x0) {
    (*(local_30._M_head_impl)->_vptr_QueryNode[1])();
  }
  SVar1 = in_RSI[1].alias.field_2._M_local_buf[8];
  pSVar4 = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator->
                     ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                      &local_28);
  pSVar4->show_type = SVar1;
  target = unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true>::operator*
                     ((unique_ptr<duckdb::ShowRef,_std::default_delete<duckdb::ShowRef>,_true> *)
                      &local_28);
  TableRef::CopyProperties(in_RSI,&target->super_TableRef);
  (this->super_TableRef)._vptr_TableRef =
       (_func_int **)
       local_28._M_t.
       super__Tuple_impl<0UL,_duckdb::ShowRef_*,_std::default_delete<duckdb::ShowRef>_>.
       super__Head_base<0UL,_duckdb::ShowRef_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> ShowRef::Copy() {
	auto copy = make_uniq<ShowRef>();

	copy->table_name = table_name;
	copy->query = query ? query->Copy() : nullptr;
	copy->show_type = show_type;
	CopyProperties(*copy);

	return std::move(copy);
}